

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O1

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::getEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  UStack *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t size;
  int iVar4;
  LanguageBreakEngine *unaff_R14;
  UErrorCode status;
  UErrorCode local_2c;
  
  size = CONCAT44(in_register_00000034,c);
  local_2c = U_ZERO_ERROR;
  umtx_lock_63((UMutex *)gBreakEngineMutex);
  if (this->fEngines == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,size);
    if (this_00 == (UStack *)0x0) {
      this_00 = (UStack *)0x0;
    }
    else {
      UStack::UStack(this_00,_deleteEngine,(UElementsAreEqual *)0x0,&local_2c);
    }
    bVar1 = U_ZERO_ERROR < local_2c;
    if (this_00 == (UStack *)0x0 || bVar1) {
      if (this_00 != (UStack *)0x0) {
        (*(this_00->super_UVector).super_UObject._vptr_UObject[1])(this_00);
      }
    }
    else {
      this->fEngines = this_00;
    }
    if (this_00 == (UStack *)0x0 || bVar1) {
      unaff_R14 = (LanguageBreakEngine *)0x0;
      goto LAB_001c4701;
    }
  }
  else {
    iVar3 = (this->fEngines->super_UVector).count;
    bVar1 = iVar3 < 1;
    if (0 < iVar3) {
      iVar3 = iVar3 + 1;
      do {
        unaff_R14 = (LanguageBreakEngine *)
                    UVector::elementAt(&this->fEngines->super_UVector,iVar3 + -2);
        if ((unaff_R14 != (LanguageBreakEngine *)0x0) &&
           (iVar2 = (*unaff_R14->_vptr_LanguageBreakEngine[2])(unaff_R14,c), (char)iVar2 != '\0'))
        break;
        iVar4 = iVar3 + -1;
        iVar2 = iVar3 + -3;
        bVar1 = iVar4 < 2;
        iVar3 = iVar4;
      } while (SBORROW4(iVar4,2) == iVar2 < 0);
    }
    if (!bVar1) goto LAB_001c4701;
  }
  iVar3 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[3])(this,c);
  unaff_R14 = (LanguageBreakEngine *)CONCAT44(extraout_var,iVar3);
  if (unaff_R14 != (LanguageBreakEngine *)0x0) {
    UVector::addElement(&this->fEngines->super_UVector,unaff_R14,&local_2c);
  }
LAB_001c4701:
  umtx_unlock_63((UMutex *)gBreakEngineMutex);
  return unaff_R14;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::getEngineFor(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode  status = U_ZERO_ERROR;

    Mutex m(&gBreakEngineMutex);

    if (fEngines == NULL) {
        UStack  *engines = new UStack(_deleteEngine, NULL, status);
        if (U_FAILURE(status) || engines == NULL) {
            // Note: no way to return error code to caller.
            delete engines;
            return NULL;
        }
        fEngines = engines;
    } else {
        int32_t i = fEngines->size();
        while (--i >= 0) {
            lbe = (const LanguageBreakEngine *)(fEngines->elementAt(i));
            if (lbe != NULL && lbe->handles(c)) {
                return lbe;
            }
        }
    }
    
    // We didn't find an engine. Create one.
    lbe = loadEngineFor(c);
    if (lbe != NULL) {
        fEngines->push((void *)lbe, status);
    }
    return lbe;
}